

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueKmerIndex.cc
# Opt level: O2

void __thiscall
Unique63merIndex::Unique63merIndex(Unique63merIndex *this,SequenceDistanceGraph *sg,uint8_t _k)

{
  uint32_t uVar1;
  pointer pNVar2;
  sgNodeID_t sVar3;
  pointer puVar4;
  undefined8 uVar5;
  pointer ppVar6;
  long lVar7;
  mapped_type *pmVar8;
  size_type __n;
  pointer ppVar9;
  sgNodeID_t n;
  pointer ppVar10;
  pair<unsigned___int128,_graphStrandPos> *kidx;
  long lVar11;
  sgNodeID_t node;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  allocator_type local_3b1;
  Unique63merIndex *local_3b0;
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  kidxv;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_378;
  value_type_conflict2 local_360;
  FastaRecord r;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen_contigs;
  kmerPosFactory128 kcf;
  
  (this->kmer_to_graphposition)._M_h._M_buckets =
       &(this->kmer_to_graphposition)._M_h._M_single_bucket;
  (this->kmer_to_graphposition)._M_h._M_bucket_count = 1;
  (this->kmer_to_graphposition)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->kmer_to_graphposition)._M_h._M_element_count = 0;
  (this->kmer_to_graphposition)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->kmer_to_graphposition)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->k = _k;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->unique_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0 = this;
  std::
  _Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)this);
  kidxv.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kidxv.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kidxv.
  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.id = 0;
  r._4_4_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&kcf,
             ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x38,(value_type_conflict2 *)&r,
             (allocator_type *)&seen_contigs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->total_kmers_per_node,&kcf);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&kcf);
  lVar11 = 0;
  __n = 0;
  lVar13 = 0x38;
  for (uVar12 = 0;
      pNVar2 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pNVar2) / 0x38);
      uVar12 = uVar12 + 1) {
    Node::Node((Node *)&kcf,(Node *)((long)&(pNVar2->sequence)._M_dataplus._M_p + lVar11));
    lVar7 = kcf.super_KMerFactory128.last_unknown - (ulong)local_3b0->k;
    if ((ulong)local_3b0->k <= (ulong)kcf.super_KMerFactory128.last_unknown) {
      __n = __n + lVar7 + 1;
      (this->total_kmers_per_node).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar12] = lVar7 + 1;
    }
    std::__cxx11::string::~string((string *)&kcf);
    lVar11 = lVar11 + 0x38;
  }
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::reserve(&kidxv,__n);
  r.name._M_dataplus._M_p = (pointer)&r.name.field_2;
  r.name._M_string_length = 0;
  r.name.field_2._M_local_buf[0] = '\0';
  r.seq._M_dataplus._M_p = (pointer)&r.seq.field_2;
  r.seq._M_string_length = 0;
  r.seq.field_2._M_local_buf[0] = '\0';
  kmerPosFactory128::kmerPosFactory128(&kcf,local_3b0->k);
  for (uVar12 = 1;
      pNVar2 = (sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)(((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pNVar2) / 0x38);
      uVar12 = uVar12 + 1) {
    if ((ulong)local_3b0->k <= *(ulong *)((long)&(pNVar2->sequence)._M_string_length + lVar13)) {
      r.id = (int32_t)uVar12;
      std::__cxx11::string::_M_assign((string *)&r.seq);
      kmerPosFactory128::setFileRecord(&kcf,&r);
      kmerPosFactory128::next_element(&kcf,&kidxv);
    }
    lVar13 = lVar13 + 0x38;
  }
  ppVar6 = kidxv.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = kidxv.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kidxv.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      kidxv.
      super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar11 = (long)kidxv.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)kidxv.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = lVar11 >> 5;
    lVar13 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
              (kidxv.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               kidxv.
               super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar6,ppVar9);
    }
    else {
      ppVar10 = ppVar6 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                (ppVar6,ppVar10);
      for (; ppVar10 != ppVar9; ppVar10 = ppVar10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,graphStrandPos>*,std::vector<std::pair<unsigned__int128,graphStrandPos>,std::allocator<std::pair<unsigned__int128,graphStrandPos>>>>,__gnu_cxx::__ops::_Val_comp_iter<Unique63merIndex::Unique63merIndex(SequenceDistanceGraph_const&,unsigned_char)::__0>>
                  ();
      }
    }
  }
  ppVar9 = kidxv.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = kidxv.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (ppVar10 = ppVar6,
        ppVar10 < kidxv.
                  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    lVar13 = 0;
    while ((ppVar6 = (pointer)((long)&ppVar10->first + lVar13),
           ppVar6 != kidxv.
                     super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
           (auVar14[0] = -((char)ppVar6->first == (char)ppVar10->first),
           auVar14[1] = -(*(char *)((long)&ppVar6->first + 1) ==
                         *(char *)((long)&ppVar10->first + 1)),
           auVar14[2] = -(*(char *)((long)&ppVar6->first + 2) ==
                         *(char *)((long)&ppVar10->first + 2)),
           auVar14[3] = -(*(char *)((long)&ppVar6->first + 3) ==
                         *(char *)((long)&ppVar10->first + 3)),
           auVar14[4] = -(*(char *)((long)&ppVar6->first + 4) ==
                         *(char *)((long)&ppVar10->first + 4)),
           auVar14[5] = -(*(char *)((long)&ppVar6->first + 5) ==
                         *(char *)((long)&ppVar10->first + 5)),
           auVar14[6] = -(*(char *)((long)&ppVar6->first + 6) ==
                         *(char *)((long)&ppVar10->first + 6)),
           auVar14[7] = -(*(char *)((long)&ppVar6->first + 7) ==
                         *(char *)((long)&ppVar10->first + 7)),
           auVar14[8] = -(*(char *)((long)&ppVar6->first + 8) ==
                         *(char *)((long)&ppVar10->first + 8)),
           auVar14[9] = -(*(char *)((long)&ppVar6->first + 9) ==
                         *(char *)((long)&ppVar10->first + 9)),
           auVar14[10] = -(*(char *)((long)&ppVar6->first + 10) ==
                          *(char *)((long)&ppVar10->first + 10)),
           auVar14[0xb] = -(*(char *)((long)&ppVar6->first + 0xb) ==
                           *(char *)((long)&ppVar10->first + 0xb)),
           auVar14[0xc] = -(*(char *)((long)&ppVar6->first + 0xc) ==
                           *(char *)((long)&ppVar10->first + 0xc)),
           auVar14[0xd] = -(*(char *)((long)&ppVar6->first + 0xd) ==
                           *(char *)((long)&ppVar10->first + 0xd)),
           auVar14[0xe] = -(*(char *)((long)&ppVar6->first + 0xe) ==
                           *(char *)((long)&ppVar10->first + 0xe)),
           auVar14[0xf] = -(*(char *)((long)&ppVar6->first + 0xf) ==
                           *(char *)((long)&ppVar10->first + 0xf)),
           (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar14[0xf] >> 7) << 0xf) == 0xffff))) {
      lVar13 = lVar13 + 0x20;
    }
    if (lVar13 == 0x20) {
      uVar5 = *(undefined8 *)((long)&ppVar10->first + 8);
      *(long *)&ppVar9->first = (long)ppVar10->first;
      *(undefined8 *)((long)&ppVar9->first + 8) = uVar5;
      (ppVar9->second).node = (ppVar10->second).node;
      (ppVar9->second).pos = (ppVar10->second).pos;
      ppVar9 = ppVar9 + 1;
      ppVar6 = ppVar10 + 1;
    }
  }
  std::
  vector<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::resize(&kidxv,(long)ppVar9 -
                  (long)kidxv.
                        super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  seen_contigs._M_h._M_buckets = &seen_contigs._M_h._M_single_bucket;
  seen_contigs._M_h._M_bucket_count = 1;
  seen_contigs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_contigs._M_h._M_element_count = 0;
  seen_contigs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_contigs._M_h._M_rehash_policy._M_next_resize = 0;
  seen_contigs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Rehash_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
             *)&seen_contigs,
            ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x38);
  local_360 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_378,
             ((long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x38,&local_360,&local_3b1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->unique_kmers_per_node,&local_378);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_378);
  std::__detail::
  _Rehash_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)local_3b0,
            (long)kidxv.
                  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)kidxv.
                  super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  ppVar6 = kidxv.
           super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = kidxv.
                super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar6; ppVar9 = ppVar9 + 1) {
    sVar3 = (ppVar9->second).node;
    uVar1 = (ppVar9->second).pos;
    pmVar8 = std::__detail::
             _Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned___int128,_std::pair<const_unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<const_unsigned___int128,_graphStrandPos>_>,_std::__detail::_Select1st,_std::equal_to<unsigned___int128>,_int128_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_3b0,&ppVar9->first);
    pmVar8->node = sVar3;
    pmVar8->pos = uVar1;
    lVar13 = (ppVar9->second).node;
    lVar11 = -lVar13;
    if (0 < lVar13) {
      lVar11 = lVar13;
    }
    puVar4 = (this->unique_kmers_per_node).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + lVar11;
    *puVar4 = *puVar4 + 1;
    puVar4 = (pointer)(ppVar9->second).node;
    local_378._M_impl.super__Vector_impl_data._M_start = (pointer)-(long)puVar4;
    if (0 < (long)puVar4) {
      local_378._M_impl.super__Vector_impl_data._M_start = puVar4;
    }
    std::__detail::
    _Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&seen_contigs,(value_type *)&local_378);
  }
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&seen_contigs._M_h);
  FastaRecord::~FastaRecord(&kcf.currentRecord);
  FastaRecord::~FastaRecord(&r);
  std::
  _Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
  ::~_Vector_base(&kidxv.
                   super__Vector_base<std::pair<unsigned___int128,_graphStrandPos>,_std::allocator<std::pair<unsigned___int128,_graphStrandPos>_>_>
                 );
  return;
}

Assistant:

Unique63merIndex::Unique63merIndex(const SequenceDistanceGraph &sg, const uint8_t _k) : k(_k){
    kmer_to_graphposition.clear();
    std::vector<pair> kidxv;
    uint64_t total_k { 0 };
    total_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    for (sgNodeID_t node = 0; node < sg.nodes.size(); node++) {
        auto sgnode = sg.nodes[node];
        if (sgnode.sequence.size() >= k) {
            auto n = sgnode.sequence.size() + 1 - k;
            total_k += n;
            total_kmers_per_node[node] = n;
        }
    }
    kidxv.reserve(total_k);
    FastaRecord r;
    kmerPosFactory128 kcf({k});
    for (sgNodeID_t n = 1; n < sg.nodes.size(); ++n) {
        if (sg.nodes[n].sequence.size() >= k) {
            r.id = n;
            r.seq = sg.nodes[n].sequence;
            kcf.setFileRecord(r);
            kcf.next_element(kidxv);
        }
    }

    sdglib::sort(kidxv.begin(),kidxv.end(),[](const pair & a, const pair & b){return a.first<b.first;});

    auto wi=kidxv.begin();
    auto ri=kidxv.begin();
    auto nri=kidxv.begin();
    while (ri<kidxv.end()){
        while (nri!=kidxv.end() and nri->first==ri->first) ++nri;
        if (nri-ri==1) {
            *wi=*ri;
            ++wi;
        }
        ri=nri;
    }
    kidxv.resize(wi - kidxv.begin());

    std::unordered_set<sgNodeID_t > seen_contigs;
    seen_contigs.reserve(sg.nodes.size());
    unique_kmers_per_node = std::vector<uint64_t>(sg.nodes.size(), 0);
    kmer_to_graphposition.reserve(kidxv.size());
    for (auto &kidx :kidxv) {
        kmer_to_graphposition[kidx.first] = { kidx.second.node, kidx.second.pos };
        unique_kmers_per_node[std::abs(kidx.second.node)] += 1;
        seen_contigs.insert(std::abs(kidx.second.node));
    }
}